

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_harbor.c
# Opt level: O0

void update_name(harbor *h,char *name,uint32_t handle)

{
  keyvalue *local_28;
  keyvalue *node;
  uint32_t handle_local;
  char *name_local;
  harbor *h_local;
  
  local_28 = hash_search(h->map,name);
  if (local_28 == (keyvalue *)0x0) {
    local_28 = hash_insert(h->map,name);
  }
  local_28->value = handle;
  if (local_28->queue != (harbor_msg_queue *)0x0) {
    dispatch_name_queue(h,local_28);
    release_queue(local_28->queue);
    local_28->queue = (harbor_msg_queue *)0x0;
  }
  return;
}

Assistant:

static void
update_name(struct harbor *h, const char name[GLOBALNAME_LENGTH], uint32_t handle) {
	struct keyvalue * node = hash_search(h->map, name);
	if (node == NULL) {
		node = hash_insert(h->map, name);
	}
	node->value = handle;
	if (node->queue) {
		dispatch_name_queue(h, node);
		release_queue(node->queue);
		node->queue = NULL;
	}
}